

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * Json::valueToString_abi_cxx11_(bool value)

{
  char *pcVar1;
  byte in_SIL;
  string *in_RDI;
  allocator local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  pcVar1 = "false";
  if (local_9 != 0) {
    pcVar1 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_a);
  std::allocator<char>::~allocator((allocator<char> *)&local_a);
  return in_RDI;
}

Assistant:

std::string valueToString(bool value) { return value ? "true" : "false"; }